

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

int ctemplate_htmlparser::HtmlparserCppTest::UpdateColumns(string *str,int column)

{
  int iVar1;
  long lVar2;
  size_t last_newline;
  int column_local;
  string *str_local;
  
  lVar2 = std::__cxx11::string::rfind((char)str,10);
  if (lVar2 == -1) {
    iVar1 = std::__cxx11::string::size();
    str_local._4_4_ = column + iVar1 + 9;
  }
  else {
    iVar1 = std::__cxx11::string::size();
    str_local._4_4_ = (iVar1 + 2) - (int)lVar2;
  }
  return str_local._4_4_;
}

Assistant:

int HtmlparserCppTest::UpdateColumns(const string &str, int column) {
  // Number of bytes since the last newline.
  size_t last_newline = str.rfind('\n');

  // If no newline was found, we just sum up all the characters in the
  // annotation.
  if (last_newline == string::npos) {
    return static_cast<int>(column + str.size() +
                            strlen(kDirectiveBegin) + strlen(kDirectiveEnd));
  // If a newline was found, the new column count becomes the number of
  // characters after the last newline.
  } else {
    return static_cast<int>(str.size() + strlen(kDirectiveEnd) - last_newline);
  }
}